

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

void mtele_trap(monst *mtmp,trap *trap,int in_sight)

{
  boolean bVar1;
  byte bVar2;
  char *pcVar3;
  char *monname;
  int in_sight_local;
  trap *trap_local;
  monst *mtmp_local;
  
  bVar1 = tele_restrict(mtmp);
  if (bVar1 != '\0') {
    return;
  }
  bVar1 = teleport_pet(mtmp,'\0');
  if (bVar1 == '\0') {
    return;
  }
  pcVar3 = Monnam(mtmp);
  if (((byte)trap->field_0x8 >> 6 & 1) == 0) {
    rloc(level,mtmp,'\0');
  }
  else {
    mvault_tele(mtmp);
  }
  if (in_sight == 0) {
    return;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_002faa6f;
    if ((((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
       (((u.uprops[0x40].intrinsic != 0 ||
         ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        ((mtmp->data->mflags3 & 0x200) != 0)))) {
      bVar2 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x002faa69;
    }
  }
  else {
    bVar2 = worm_known(level,mtmp);
joined_r0x002faa69:
    if (bVar2 != 0) {
LAB_002faa6f:
      if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
         ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
           ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0)))) {
        pline("%s seems disoriented.",pcVar3);
        goto LAB_002fab1e;
      }
    }
  }
  pline("%s suddenly disappears!",pcVar3);
LAB_002fab1e:
  seetrap(trap);
  return;
}

Assistant:

void mtele_trap(struct monst *mtmp, struct trap *trap, int in_sight)
{
	char *monname;

	if (tele_restrict(mtmp)) return;
	if (teleport_pet(mtmp, FALSE)) {
	    /* save name with pre-movement visibility */
	    monname = Monnam(mtmp);

	    /* Note: don't remove the trap if a vault.  Other-
	     * wise the monster will be stuck there, since
	     * the guard isn't going to come for it...
	     */
	    if (trap->once) mvault_tele(mtmp);
	    else rloc(level, mtmp, FALSE);

	    if (in_sight) {
		if (canseemon(level, mtmp))
		    pline("%s seems disoriented.", monname);
		else
		    pline("%s suddenly disappears!", monname);
		seetrap(trap);
	    }
	}
}